

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O1

void secp256k1_fe_mul_int_unchecked(secp256k1_fe *r,int a)

{
  secp256k1_modinv64_modinfo *psVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  secp256k1_ge *psVar5;
  secp256k1_ge *psVar6;
  secp256k1_ge *psVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  secp256k1_ge *psVar13;
  long lVar14;
  long lVar15;
  secp256k1_ge *psVar16;
  ulong uVar17;
  secp256k1_ge *psVar18;
  secp256k1_ge *psVar19;
  secp256k1_ge *a_00;
  secp256k1_ge *a_01;
  long lVar20;
  uint64_t *puVar21;
  long lVar22;
  uint uVar23;
  long lVar24;
  secp256k1_ge *psVar25;
  secp256k1_ge *a_02;
  bool bVar26;
  undefined1 auVar27 [16];
  secp256k1_strauss_state sStack_b50;
  secp256k1_gej sStack_b38;
  secp256k1_fe asStack_aa0 [8];
  secp256k1_ge asStack_920 [8];
  secp256k1_strauss_point_state sStack_5e0;
  secp256k1_ge *psStack_1d0;
  secp256k1_ge *psStack_1c8;
  code *pcStack_1c0;
  secp256k1_ge *psStack_1b0;
  secp256k1_ge *psStack_1a8;
  secp256k1_modinv64_modinfo *psStack_1a0;
  ulong uStack_198;
  secp256k1_ge *psStack_190;
  secp256k1_ge *psStack_188;
  ulong uStack_180;
  secp256k1_ge *psStack_178;
  secp256k1_ge *psStack_170;
  undefined1 auStack_168 [96];
  ulong uStack_108;
  secp256k1_ge *psStack_100;
  undefined1 auStack_f8 [56];
  ulong uStack_c0;
  ulong uStack_b8;
  secp256k1_ge *psStack_b0;
  secp256k1_modinv64_signed62 sStack_a8;
  secp256k1_modinv64_signed62 sStack_78;
  secp256k1_ge *psStack_50;
  
  uVar3 = (ulong)(uint)a;
  psVar7 = (secp256k1_ge *)r;
  secp256k1_fe_verify(r);
  if ((uint)a < 0x21) {
    iVar2 = r->magnitude * a;
    if (iVar2 < 0x21) {
      r->n[0] = r->n[0] * uVar3;
      r->n[1] = r->n[1] * uVar3;
      r->n[2] = r->n[2] * uVar3;
      r->n[3] = r->n[3] * uVar3;
      r->n[4] = uVar3 * r->n[4];
      r->magnitude = iVar2;
      r->normalized = 0;
      secp256k1_fe_verify(r);
      return;
    }
  }
  else {
    secp256k1_fe_mul_int_unchecked_cold_2();
  }
  secp256k1_fe_mul_int_unchecked_cold_1();
  secp256k1_fe_verify(&psVar7->x);
  a_01 = psVar7;
  secp256k1_fe_verify_magnitude(&psVar7->x,0x1f);
  psStack_1a0 = (secp256k1_modinv64_modinfo *)(psVar7->x).n[0];
  uVar3 = -(ulong)((uint)psStack_1a0 & 1);
  uVar10 = uVar3 >> 0xc;
  uVar9 = (long)(psStack_1a0->modulus).v + (uVar10 & 0xffffefffffc2f);
  if ((uVar9 & 1) == 0) {
    uVar4 = (uVar3 >> 0x10) + (psVar7->x).n[4];
    uVar11 = uVar10 + (psVar7->x).n[3];
    uVar23 = (uint)(uVar3 >> 0x2c);
    auVar27._0_8_ = CONCAT44(uVar23,(int)uVar10);
    auVar27._8_4_ = (int)uVar10;
    auVar27._12_4_ = uVar23;
    uVar3 = auVar27._0_8_ + (psVar7->x).n[1];
    uVar10 = auVar27._8_8_ + (psVar7->x).n[2];
    (psVar7->x).n[0] = ((ulong)((uint)uVar3 & 1) << 0x33) + (uVar9 >> 1);
    (psVar7->x).n[1] = ((uVar10 & 1) << 0x33) + (uVar3 >> 1);
    (psVar7->x).n[2] = ((uVar11 & 1) << 0x33) + (uVar10 >> 1);
    (psVar7->x).n[3] = ((ulong)((uint)uVar4 & 1) << 0x33) + (uVar11 >> 1);
    (psVar7->x).n[4] = uVar4 >> 1;
    (psVar7->x).magnitude = ((psVar7->x).magnitude >> 1) + 1;
    (psVar7->x).normalized = 0;
    secp256k1_fe_verify(&psVar7->x);
    return;
  }
  secp256k1_fe_half_cold_1();
  uVar3 = 0;
  sStack_a8.v[2] = 0;
  sStack_a8.v[3] = 0;
  sStack_a8.v[0] = 0;
  sStack_a8.v[1] = 0;
  sStack_a8.v[4] = 0;
  sStack_78.v[1] = 0;
  sStack_78.v[4] = 0;
  sStack_78.v[2] = 0;
  sStack_78.v[3] = 0;
  sStack_78.v[0] = 1;
  auStack_168._32_8_ = (psStack_1a0->modulus).v[4];
  auStack_168._0_8_ = (psStack_1a0->modulus).v[0];
  psStack_178 = (secp256k1_ge *)(psStack_1a0->modulus).v[1];
  uStack_180 = (psStack_1a0->modulus).v[2];
  psStack_1a8 = (secp256k1_ge *)(psStack_1a0->modulus).v[3];
  auStack_f8._0_8_ = (a_01->x).n[0];
  psStack_188 = (secp256k1_ge *)(a_01->x).n[1];
  psStack_190 = (secp256k1_ge *)(a_01->x).n[2];
  psStack_170 = (secp256k1_ge *)(a_01->x).n[3];
  a_02 = (secp256k1_ge *)(a_01->x).n[4];
  uVar10 = 0xffffffffffffffff;
  psVar16 = (secp256k1_ge *)auStack_168._0_8_;
  psVar19 = (secp256k1_ge *)auStack_f8._0_8_;
  psVar6 = (secp256k1_ge *)auStack_168._32_8_;
  auStack_168._8_8_ = psStack_178;
  auStack_168._16_8_ = uStack_180;
  auStack_168._24_8_ = psStack_1a8;
  auStack_168._48_8_ = a_01;
  auStack_f8._8_8_ = psStack_188;
  auStack_f8._16_8_ = psStack_190;
  auStack_f8._24_8_ = psStack_170;
  auStack_f8._32_8_ = a_02;
  psStack_50 = psVar7;
  do {
    psVar1 = psStack_1a0;
    uVar4 = 8;
    lVar12 = 3;
    uVar9 = 0;
    uVar11 = 0;
    psVar18 = (secp256k1_ge *)0x8;
    psStack_1b0 = (secp256k1_ge *)0x8;
    psVar5 = psVar19;
    psVar13 = psVar16;
    psVar25 = a_02;
    do {
      auStack_168._72_8_ = uVar3;
      auStack_168._80_8_ = a_02;
      auStack_168._88_8_ = psVar6;
      if (((ulong)psVar13 & 1) == 0) {
        pcStack_1c0 = (code *)0x14e590;
        secp256k1_modinv64_cold_29();
        a_00 = a_01;
LAB_0014e590:
        pcStack_1c0 = (code *)0x14e595;
        secp256k1_modinv64_cold_1();
LAB_0014e595:
        pcStack_1c0 = (code *)0x14e59a;
        secp256k1_modinv64_cold_2();
LAB_0014e59a:
        pcStack_1c0 = (code *)0x14e59f;
        secp256k1_modinv64_cold_28();
        goto LAB_0014e59f;
      }
      a_00 = (secp256k1_ge *)(uVar9 * (long)psVar19 + uVar4 * (long)psVar16);
      psVar18 = (secp256k1_ge *)((long)psVar13 << ((byte)lVar12 & 0x3f));
      if (a_00 != psVar18) goto LAB_0014e590;
      a_00 = (secp256k1_ge *)((long)psStack_1b0 * (long)psVar19 + uVar11 * (long)psVar16);
      psVar18 = (secp256k1_ge *)((long)psVar5 << ((byte)lVar12 & 0x3f));
      if (a_00 != psVar18) goto LAB_0014e595;
      psVar18 = (secp256k1_ge *)((long)uVar10 >> 0x3f);
      uStack_108 = (ulong)((uint)psVar5 & 1);
      uVar8 = -uStack_108;
      a_01 = (secp256k1_ge *)((ulong)psVar18 & uVar8);
      uVar10 = uVar10 ^ (ulong)a_01;
      psVar7 = psVar16;
      a_00 = a_01;
      psVar25 = psVar19;
      psStack_100 = psVar18;
      if (uVar10 - 0x251 < 0xfffffffffffffb61) goto LAB_0014e59a;
      uVar10 = uVar10 - 1;
      a_00 = (secp256k1_ge *)
             ((long)(psStack_1b0->x).n + (((ulong)psVar18 ^ uVar9) - (long)psVar18 & uVar8));
      uVar9 = (uVar9 + ((ulong)a_00 & (ulong)a_01)) * 2;
      uVar11 = uVar11 + (((ulong)psVar18 ^ uVar4) - (long)psVar18 & uVar8);
      uVar4 = (uVar4 + (uVar11 & (ulong)a_01)) * 2;
      uVar8 = (long)(psVar5->x).n + (((ulong)psVar18 ^ (ulong)psVar13) - (long)psVar18 & uVar8);
      psVar5 = (secp256k1_ge *)(uVar8 >> 1);
      psVar13 = (secp256k1_ge *)((long)(psVar13->x).n + (uVar8 & (ulong)a_01));
      lVar12 = lVar12 + 1;
      psStack_1b0 = a_00;
    } while (lVar12 != 0x3e);
    psVar18 = (secp256k1_ge *)(uVar9 * uVar11);
    auStack_f8._48_8_ = uVar4;
    uStack_c0 = uVar9;
    uStack_b8 = uVar11;
    psStack_b0 = a_00;
    if ((SUB168(SEXT816((long)uVar4) * SEXT816((long)a_00),8) -
        SUB168(SEXT816((long)uVar9) * SEXT816((long)uVar11),8)) -
        (ulong)((secp256k1_ge *)(uVar4 * (long)a_00) < psVar18) != 2 ||
        (long)(uVar4 * (long)a_00) - (long)psVar18 != 0) {
LAB_0014e59f:
      pcStack_1c0 = (code *)0x14e5a4;
      secp256k1_modinv64_cold_3();
LAB_0014e5a4:
      pcStack_1c0 = (code *)0x14e5a9;
      secp256k1_modinv64_cold_27();
LAB_0014e5a9:
      pcStack_1c0 = (code *)0x14e5ae;
      secp256k1_modinv64_cold_26();
LAB_0014e5ae:
      psVar6 = a_00;
      pcStack_1c0 = (code *)0x14e5b3;
      secp256k1_modinv64_cold_25();
LAB_0014e5b3:
      pcStack_1c0 = (code *)0x14e5b8;
      secp256k1_modinv64_cold_24();
LAB_0014e5b8:
      pcStack_1c0 = (code *)0x14e5bd;
      secp256k1_modinv64_cold_4();
LAB_0014e5bd:
      pcStack_1c0 = (code *)0x14e5c2;
      secp256k1_modinv64_cold_5();
LAB_0014e5c2:
      pcStack_1c0 = (code *)0x14e5c7;
      secp256k1_modinv64_cold_6();
LAB_0014e5c7:
      pcStack_1c0 = (code *)0x14e5cc;
      secp256k1_modinv64_cold_7();
LAB_0014e5cc:
      pcStack_1c0 = (code *)0x14e5d1;
      secp256k1_modinv64_cold_8();
LAB_0014e5d1:
      pcStack_1c0 = (code *)0x14e5d6;
      secp256k1_modinv64_cold_9();
LAB_0014e5d6:
      pcStack_1c0 = (code *)0x14e5db;
      secp256k1_modinv64_cold_10();
      psVar16 = psVar7;
LAB_0014e5db:
      pcStack_1c0 = (code *)0x14e5e0;
      secp256k1_modinv64_cold_11();
LAB_0014e5e0:
      pcStack_1c0 = (code *)0x14e5e5;
      secp256k1_modinv64_cold_12();
      a_02 = psVar25;
LAB_0014e5e5:
      pcStack_1c0 = (code *)0x14e5ea;
      secp256k1_modinv64_cold_13();
LAB_0014e5ea:
      pcStack_1c0 = (code *)0x14e5ef;
      secp256k1_modinv64_cold_14();
LAB_0014e5ef:
      pcStack_1c0 = (code *)0x14e5f4;
      secp256k1_modinv64_cold_15();
LAB_0014e5f4:
      pcStack_1c0 = (code *)0x14e5f9;
      secp256k1_modinv64_cold_23();
      psVar19 = psVar18;
LAB_0014e5f9:
      pcStack_1c0 = (code *)0x14e5fe;
      secp256k1_modinv64_cold_22();
LAB_0014e5fe:
      a_01 = psVar6;
      pcStack_1c0 = (code *)0x14e603;
      secp256k1_modinv64_cold_21();
      psVar7 = psVar16;
LAB_0014e603:
      pcStack_1c0 = (code *)0x14e608;
      secp256k1_modinv64_cold_20();
LAB_0014e608:
      pcStack_1c0 = (code *)0x14e60d;
      secp256k1_modinv64_cold_19();
LAB_0014e60d:
      pcStack_1c0 = (code *)0x14e612;
      secp256k1_modinv64_cold_18();
      goto LAB_0014e612;
    }
    pcStack_1c0 = (code *)0x14dd3b;
    uStack_198 = uVar11;
    secp256k1_modinv64_update_de_62
              (&sStack_a8,&sStack_78,(secp256k1_modinv64_trans2x2 *)(auStack_f8 + 0x30),psStack_1a0)
    ;
    a_00 = (secp256k1_ge *)auStack_168;
    psVar18 = (secp256k1_ge *)0x5;
    pcStack_1c0 = (code *)0x14dd54;
    iVar2 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)a_00,5,&psVar1->modulus,-1)
    ;
    if (iVar2 < 1) goto LAB_0014e5a4;
    a_00 = (secp256k1_ge *)auStack_168;
    psVar18 = (secp256k1_ge *)0x5;
    pcStack_1c0 = (code *)0x14dd75;
    iVar2 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)a_00,5,&psStack_1a0->modulus,1);
    if (0 < iVar2) goto LAB_0014e5a9;
    psVar6 = (secp256k1_ge *)auStack_f8;
    psVar18 = (secp256k1_ge *)0x5;
    pcStack_1c0 = (code *)0x14dd9e;
    a_00 = psVar6;
    iVar2 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar6,5,&psStack_1a0->modulus,-1);
    if (iVar2 < 1) goto LAB_0014e5ae;
    psVar18 = (secp256k1_ge *)0x5;
    pcStack_1c0 = (code *)0x14ddbd;
    iVar2 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar6,5,&psStack_1a0->modulus,1);
    psVar1 = psStack_1a0;
    if (-1 < iVar2) goto LAB_0014e5b3;
    psVar6 = (secp256k1_ge *)(uVar4 * (long)psVar16);
    psVar18 = SUB168(SEXT816((long)uVar4) * SEXT816((long)psVar16),8);
    uVar3 = uVar9 * (long)psVar19;
    lVar12 = SUB168(SEXT816((long)uVar9) * SEXT816((long)psVar19),8);
    if ((-1 < lVar12) &&
       (uVar11 = (ulong)((secp256k1_ge *)(-1 - uVar3) < psVar6),
       lVar14 = (0x7fffffffffffffff - lVar12) - (long)psVar18,
       (SBORROW8(0x7fffffffffffffff - lVar12,(long)psVar18) != SBORROW8(lVar14,uVar11)) !=
       (long)(lVar14 - uVar11) < 0)) goto LAB_0014e5b8;
    puVar21 = (uint64_t *)((long)(psVar6->x).n + uVar3);
    lVar12 = (long)(psVar18->x).n + (ulong)CARRY8(uVar3,(ulong)psVar6) + lVar12;
    psVar6 = (secp256k1_ge *)(uStack_198 * (long)psVar16);
    psVar18 = SUB168(SEXT816((long)uStack_198) * SEXT816((long)psVar16),8);
    uVar3 = (long)psStack_1b0 * (long)psVar19;
    lVar14 = SUB168(SEXT816((long)psStack_1b0) * SEXT816((long)psVar19),8);
    if ((-1 < lVar14) &&
       (uVar11 = (ulong)((secp256k1_ge *)(-1 - uVar3) < psVar6),
       lVar15 = (0x7fffffffffffffff - lVar14) - (long)psVar18,
       (SBORROW8(0x7fffffffffffffff - lVar14,(long)psVar18) != SBORROW8(lVar15,uVar11)) !=
       (long)(lVar15 - uVar11) < 0)) goto LAB_0014e5bd;
    bVar26 = CARRY8((ulong)psVar6,uVar3);
    psVar6 = (secp256k1_ge *)((long)(psVar6->x).n + uVar3);
    psVar18 = (secp256k1_ge *)((long)(psVar18->x).n + (ulong)bVar26 + lVar14);
    if (((ulong)puVar21 & 0x3ffffffffffffffe) != 0) goto LAB_0014e5c2;
    if (((ulong)psVar6 & 0x3fffffffffffffff) != 0) goto LAB_0014e5c7;
    uVar3 = (ulong)puVar21 >> 0x3e | lVar12 * 4;
    uVar11 = (long)psStack_178 * uVar4 + uVar3;
    lVar20 = SUB168(SEXT816((long)psStack_178) * SEXT816((long)uVar4),8) + (lVar12 >> 0x3e) +
             (ulong)CARRY8((long)psStack_178 * uVar4,uVar3);
    psVar7 = (secp256k1_ge *)((long)psStack_188 * uVar9);
    lVar15 = SUB168(SEXT816((long)psStack_188) * SEXT816((long)uVar9),8);
    uVar3 = (ulong)(-(long)psVar7 - 1U < uVar11);
    lVar12 = (0x7fffffffffffffff - lVar15) - lVar20;
    lVar22 = (-0x8000000000000000 - lVar15) - (ulong)(psVar7 != (secp256k1_ge *)0x0);
    lVar14 = lVar20 - lVar22;
    bVar26 = (SBORROW8(0x7fffffffffffffff - lVar15,lVar20) != SBORROW8(lVar12,uVar3)) ==
             (long)(lVar12 - uVar3) < 0;
    if (lVar15 < 0) {
      bVar26 = (SBORROW8(lVar20,lVar22) != SBORROW8(lVar14,(ulong)(uVar11 < (ulong)-(long)psVar7)))
               == (long)(lVar14 - (ulong)(uVar11 < (ulong)-(long)psVar7)) < 0;
    }
    psVar25 = psStack_188;
    if (!bVar26) goto LAB_0014e5cc;
    uVar3 = (ulong)psVar6 >> 0x3e | (long)psVar18 * 4;
    uVar17 = (long)psStack_178 * uStack_198 + uVar3;
    lVar14 = SUB168(SEXT816((long)psStack_178) * SEXT816((long)uStack_198),8) +
             ((long)psVar18 >> 0x3e) + (ulong)CARRY8((long)psStack_178 * uStack_198,uVar3);
    uVar8 = (long)psStack_188 * (long)psStack_1b0;
    psVar6 = SUB168(SEXT816((long)psStack_188) * SEXT816((long)psStack_1b0),8);
    uVar3 = (ulong)(-uVar8 - 1 < uVar17);
    lVar12 = (0x7fffffffffffffff - (long)psVar6) - lVar14;
    psVar18 = (secp256k1_ge *)((-0x8000000000000000 - (long)psVar6) - (ulong)(uVar8 != 0));
    bVar26 = (SBORROW8(0x7fffffffffffffff - (long)psVar6,lVar14) != SBORROW8(lVar12,uVar3)) ==
             (long)(lVar12 - uVar3) < 0;
    if ((long)psVar6 < 0) {
      bVar26 = (SBORROW8(lVar14,(long)psVar18) !=
               SBORROW8(lVar14 - (long)psVar18,(ulong)(uVar17 < -uVar8))) ==
               (long)((lVar14 - (long)psVar18) - (ulong)(uVar17 < -uVar8)) < 0;
    }
    if (!bVar26) goto LAB_0014e5d1;
    uVar3 = (long)(psVar7->x).n + uVar11;
    lVar12 = lVar15 + lVar20 + (ulong)CARRY8((ulong)psVar7,uVar11);
    psVar6 = (secp256k1_ge *)((long)(psVar6->x).n + (ulong)CARRY8(uVar8,uVar17) + lVar14);
    uVar11 = lVar12 * 4 | uVar3 >> 0x3e;
    auStack_168._0_8_ = uVar3 & 0x3fffffffffffffff;
    psVar7 = (secp256k1_ge *)(uVar8 + uVar17 & 0x3fffffffffffffff);
    psStack_178 = (secp256k1_ge *)(uStack_180 * uVar4 + uVar11);
    lVar14 = (lVar12 >> 0x3e) + SUB168(SEXT816((long)uStack_180) * SEXT816((long)uVar4),8) +
             (ulong)CARRY8(uStack_180 * uVar4,uVar11);
    psStack_188 = (secp256k1_ge *)((long)psStack_190 * uVar9);
    lVar15 = SUB168(SEXT816((long)psStack_190) * SEXT816((long)uVar9),8);
    uVar3 = (ulong)((secp256k1_ge *)(-1 - (long)psStack_188) < psStack_178);
    lVar12 = (0x7fffffffffffffff - lVar15) - lVar14;
    psVar18 = (secp256k1_ge *)
              ((-0x8000000000000000 - lVar15) - (ulong)(psStack_188 != (secp256k1_ge *)0x0));
    bVar26 = (SBORROW8(0x7fffffffffffffff - lVar15,lVar14) != SBORROW8(lVar12,uVar3)) ==
             (long)(lVar12 - uVar3) < 0;
    if (lVar15 < 0) {
      bVar26 = (SBORROW8(lVar14,(long)psVar18) !=
               SBORROW8(lVar14 - (long)psVar18,
                        (ulong)(psStack_178 < (secp256k1_ge *)-(long)psStack_188))) ==
               (long)((lVar14 - (long)psVar18) -
                     (ulong)(psStack_178 < (secp256k1_ge *)-(long)psStack_188)) < 0;
    }
    psVar25 = psStack_190;
    auStack_168._64_8_ = psVar7;
    auStack_f8._0_8_ = psVar7;
    if (!bVar26) goto LAB_0014e5d6;
    uVar3 = uVar8 + uVar17 >> 0x3e | (long)psVar6 * 4;
    uVar8 = uStack_180 * uStack_198 + uVar3;
    psVar18 = (secp256k1_ge *)
              (SUB168(SEXT816((long)uStack_180) * SEXT816((long)uStack_198),8) +
               ((long)psVar6 >> 0x3e) + (ulong)CARRY8(uStack_180 * uStack_198,uVar3));
    uVar11 = (long)psStack_190 * (long)psStack_1b0;
    lVar22 = SUB168(SEXT816((long)psStack_190) * SEXT816((long)psStack_1b0),8);
    uVar3 = (ulong)(-uVar11 - 1 < uVar8);
    lVar12 = (0x7fffffffffffffff - lVar22) - (long)psVar18;
    lVar24 = (-0x8000000000000000 - lVar22) - (ulong)(uVar11 != 0);
    lVar20 = (long)psVar18 - lVar24;
    bVar26 = (SBORROW8(0x7fffffffffffffff - lVar22,(long)psVar18) != SBORROW8(lVar12,uVar3)) ==
             (long)(lVar12 - uVar3) < 0;
    if (lVar22 < 0) {
      bVar26 = (SBORROW8((long)psVar18,lVar24) != SBORROW8(lVar20,(ulong)(uVar8 < -uVar11))) ==
               (long)(lVar20 - (ulong)(uVar8 < -uVar11)) < 0;
    }
    psVar6 = (secp256k1_ge *)(ulong)bVar26;
    psVar16 = psVar7;
    auStack_168._56_8_ = auStack_168._0_8_;
    if (bVar26 == false) goto LAB_0014e5db;
    uVar17 = (long)(psStack_178->x).n + (long)(psStack_188->x).n;
    lVar12 = lVar14 + lVar15 + (ulong)CARRY8((ulong)psStack_178,(ulong)psStack_188);
    psVar18 = (secp256k1_ge *)((long)(psVar18->x).n + (ulong)CARRY8(uVar8,uVar11) + lVar22);
    uVar3 = lVar12 * 4 | uVar17 >> 0x3e;
    psVar25 = (secp256k1_ge *)(uVar17 & 0x3fffffffffffffff);
    psStack_188 = (secp256k1_ge *)(uVar8 + uVar11 & 0x3fffffffffffffff);
    uVar17 = (long)psStack_1a8 * uVar4 + uVar3;
    lVar14 = (lVar12 >> 0x3e) + SUB168(SEXT816((long)psStack_1a8) * SEXT816((long)uVar4),8) +
             (ulong)CARRY8((long)psStack_1a8 * uVar4,uVar3);
    psStack_190 = (secp256k1_ge *)((long)psStack_170 * uVar9);
    lVar15 = SUB168(SEXT816((long)psStack_170) * SEXT816((long)uVar9),8);
    uVar3 = (ulong)(-(long)psStack_190 - 1U < uVar17);
    lVar12 = (0x7fffffffffffffff - lVar15) - lVar14;
    psVar6 = (secp256k1_ge *)
             ((-0x8000000000000000 - lVar15) - (ulong)(psStack_190 != (secp256k1_ge *)0x0));
    bVar26 = (SBORROW8(0x7fffffffffffffff - lVar15,lVar14) != SBORROW8(lVar12,uVar3)) ==
             (long)(lVar12 - uVar3) < 0;
    if (lVar15 < 0) {
      bVar26 = (SBORROW8(lVar14,(long)psVar6) !=
               SBORROW8(lVar14 - (long)psVar6,(ulong)(uVar17 < (ulong)-(long)psStack_190))) ==
               (long)((lVar14 - (long)psVar6) - (ulong)(uVar17 < (ulong)-(long)psStack_190)) < 0;
    }
    psVar16 = psStack_170;
    auStack_168._8_8_ = psVar25;
    auStack_f8._8_8_ = psStack_188;
    if (!bVar26) goto LAB_0014e5e0;
    uVar3 = uVar8 + uVar11 >> 0x3e | (long)psVar18 * 4;
    uVar8 = (long)psStack_1a8 * uStack_198 + uVar3;
    psVar6 = (secp256k1_ge *)
             (SUB168(SEXT816((long)psStack_1a8) * SEXT816((long)uStack_198),8) +
              ((long)psVar18 >> 0x3e) + (ulong)CARRY8((long)psStack_1a8 * uStack_198,uVar3));
    uVar11 = (long)psStack_170 * (long)psStack_1b0;
    lVar22 = SUB168(SEXT816((long)psStack_170) * SEXT816((long)psStack_1b0),8);
    uVar3 = (ulong)(-uVar11 - 1 < uVar8);
    lVar12 = (0x7fffffffffffffff - lVar22) - (long)psVar6;
    lVar24 = (-0x8000000000000000 - lVar22) - (ulong)(uVar11 != 0);
    lVar20 = (long)psVar6 - lVar24;
    bVar26 = (SBORROW8(0x7fffffffffffffff - lVar22,(long)psVar6) != SBORROW8(lVar12,uVar3)) ==
             (long)(lVar12 - uVar3) < 0;
    if (lVar22 < 0) {
      bVar26 = (SBORROW8((long)psVar6,lVar24) != SBORROW8(lVar20,(ulong)(uVar8 < -uVar11))) ==
               (long)(lVar20 - (ulong)(uVar8 < -uVar11)) < 0;
    }
    psVar18 = (secp256k1_ge *)(ulong)bVar26;
    a_02 = psVar25;
    uStack_180 = uVar17;
    if (bVar26 == false) goto LAB_0014e5e5;
    uStack_180 = (long)(psStack_190->x).n + uVar17;
    lVar12 = lVar14 + lVar15 + (ulong)CARRY8(uVar17,(ulong)psStack_190);
    psVar6 = (secp256k1_ge *)((long)(psVar6->x).n + (ulong)CARRY8(uVar8,uVar11) + lVar22);
    uVar3 = lVar12 * 4 | uStack_180 >> 0x3e;
    uStack_180 = uStack_180 & 0x3fffffffffffffff;
    psStack_190 = (secp256k1_ge *)(uVar8 + uVar11 & 0x3fffffffffffffff);
    psStack_1a8 = (secp256k1_ge *)(auStack_168._88_8_ * uVar4 + uVar3);
    lVar15 = (lVar12 >> 0x3e) + SUB168(SEXT816((long)auStack_168._88_8_) * SEXT816((long)uVar4),8) +
             (ulong)CARRY8(auStack_168._88_8_ * uVar4,uVar3);
    uVar4 = auStack_168._80_8_ * uVar9;
    psVar18 = SUB168(SEXT816((long)auStack_168._80_8_) * SEXT816((long)uVar9),8);
    uVar3 = (ulong)((secp256k1_ge *)(-1 - uVar4) < psStack_1a8);
    lVar12 = (0x7fffffffffffffff - (long)psVar18) - lVar15;
    lVar20 = (-0x8000000000000000 - (long)psVar18) - (ulong)(uVar4 != 0);
    lVar14 = lVar15 - lVar20;
    bVar26 = (SBORROW8(0x7fffffffffffffff - (long)psVar18,lVar15) != SBORROW8(lVar12,uVar3)) ==
             (long)(lVar12 - uVar3) < 0;
    if ((long)psVar18 < 0) {
      bVar26 = (SBORROW8(lVar15,lVar20) !=
               SBORROW8(lVar14,(ulong)(psStack_1a8 < (secp256k1_ge *)-uVar4))) ==
               (long)(lVar14 - (ulong)(psStack_1a8 < (secp256k1_ge *)-uVar4)) < 0;
    }
    psVar16 = (secp256k1_ge *)auStack_168._80_8_;
    a_02 = psStack_190;
    psStack_178 = psVar25;
    auStack_168._16_8_ = uStack_180;
    auStack_f8._16_8_ = psStack_190;
    if (!bVar26) goto LAB_0014e5ea;
    uVar3 = uVar8 + uVar11 >> 0x3e | (long)psVar6 * 4;
    a_02 = (secp256k1_ge *)(auStack_168._88_8_ * uStack_198 + uVar3);
    lVar22 = SUB168(SEXT816((long)auStack_168._88_8_) * SEXT816((long)uStack_198),8) +
             ((long)psVar6 >> 0x3e) + (ulong)CARRY8(auStack_168._88_8_ * uStack_198,uVar3);
    uVar9 = auStack_168._80_8_ * (long)psStack_1b0;
    lVar20 = SUB168(SEXT816((long)auStack_168._80_8_) * SEXT816((long)psStack_1b0),8);
    uVar3 = (ulong)((secp256k1_ge *)(-1 - uVar9) < a_02);
    lVar12 = (0x7fffffffffffffff - lVar20) - lVar22;
    lVar24 = (-0x8000000000000000 - lVar20) - (ulong)(uVar9 != 0);
    lVar14 = lVar22 - lVar24;
    bVar26 = (SBORROW8(0x7fffffffffffffff - lVar20,lVar22) != SBORROW8(lVar12,uVar3)) ==
             (long)(lVar12 - uVar3) < 0;
    if (lVar20 < 0) {
      bVar26 = (SBORROW8(lVar22,lVar24) != SBORROW8(lVar14,(ulong)(a_02 < (secp256k1_ge *)-uVar9)))
               == (long)(lVar14 - (ulong)(a_02 < (secp256k1_ge *)-uVar9)) < 0;
    }
    psVar6 = (secp256k1_ge *)(ulong)bVar26;
    if (bVar26 == false) goto LAB_0014e5ef;
    puVar21 = (uint64_t *)((long)(psStack_1a8->x).n + uVar4);
    lVar12 = (long)(psVar18->x).n + (ulong)CARRY8((ulong)psStack_1a8,uVar4) + lVar15;
    bVar26 = CARRY8((ulong)a_02,uVar9);
    a_02 = (secp256k1_ge *)((long)(a_02->x).n + uVar9);
    lVar14 = lVar22 + lVar20 + (ulong)bVar26;
    psVar18 = (secp256k1_ge *)(lVar12 * 4 | (ulong)puVar21 >> 0x3e);
    psVar6 = (secp256k1_ge *)((ulong)puVar21 & 0x3fffffffffffffff);
    psVar16 = (secp256k1_ge *)((ulong)a_02 & 0x3fffffffffffffff);
    auStack_168._24_8_ = psVar6;
    auStack_f8._24_8_ = psVar16;
    if ((lVar12 >> 0x3e) + -1 + (ulong)((secp256k1_ge *)0x7fffffffffffffff < psVar18) != -1)
    goto LAB_0014e5f4;
    a_02 = (secp256k1_ge *)((ulong)a_02 >> 0x3e | lVar14 * 4);
    psVar19 = psVar18;
    auStack_168._32_8_ = psVar18;
    if ((lVar14 >> 0x3e) + -1 + (ulong)((secp256k1_ge *)0x7fffffffffffffff < a_02) != -1)
    goto LAB_0014e5f9;
    a_01 = (secp256k1_ge *)auStack_168;
    psVar19 = (secp256k1_ge *)0x5;
    pcStack_1c0 = (code *)0x14e3eb;
    psVar7 = a_01;
    psStack_1a8 = psVar6;
    auStack_f8._32_8_ = a_02;
    iVar2 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)a_01,5,&psStack_1a0->modulus,-1);
    psVar6 = psVar7;
    if (iVar2 < 1) goto LAB_0014e5fe;
    psVar19 = (secp256k1_ge *)0x5;
    pcStack_1c0 = (code *)0x14e408;
    iVar2 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)a_01,5,&psVar1->modulus,1);
    psVar7 = psVar16;
    if (0 < iVar2) goto LAB_0014e603;
    psVar7 = (secp256k1_ge *)auStack_f8;
    psVar19 = (secp256k1_ge *)0x5;
    pcStack_1c0 = (code *)0x14e434;
    a_01 = psVar7;
    psStack_170 = psVar16;
    iVar2 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar7,5,&psVar1->modulus,-1);
    if (iVar2 < 1) goto LAB_0014e608;
    psVar19 = (secp256k1_ge *)0x5;
    pcStack_1c0 = (code *)0x14e451;
    a_01 = psVar7;
    iVar2 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar7,5,&psVar1->modulus,1);
    if (-1 < iVar2) goto LAB_0014e60d;
    uVar23 = (int)auStack_168._72_8_ + 1;
    uVar3 = (ulong)uVar23;
    psVar16 = (secp256k1_ge *)auStack_168._56_8_;
    psVar19 = (secp256k1_ge *)auStack_168._64_8_;
    psVar6 = psVar18;
  } while (uVar23 != 10);
  a_01 = (secp256k1_ge *)auStack_f8;
  psVar19 = (secp256k1_ge *)0x5;
  pcStack_1c0 = (code *)0x14e499;
  iVar2 = secp256k1_modinv64_mul_cmp_62
                    ((secp256k1_modinv64_signed62 *)a_01,5,&SECP256K1_SIGNED62_ONE,0);
  if (iVar2 == 0) {
    pcStack_1c0 = (code *)0x14e4be;
    iVar2 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)auStack_168,5,&SECP256K1_SIGNED62_ONE,-1);
    a_02 = (secp256k1_ge *)auStack_168._48_8_;
    if (iVar2 != 0) {
      pcStack_1c0 = (code *)0x14e4e5;
      iVar2 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)auStack_168,5,&SECP256K1_SIGNED62_ONE,1);
      if (iVar2 != 0) {
        psVar19 = (secp256k1_ge *)0x5;
        pcStack_1c0 = (code *)0x14e4ff;
        a_01 = a_02;
        iVar2 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)a_02,5,&SECP256K1_SIGNED62_ONE,0);
        if (iVar2 == 0) {
          a_01 = (secp256k1_ge *)&sStack_a8;
          psVar19 = (secp256k1_ge *)0x5;
          pcStack_1c0 = (code *)0x14e522;
          iVar2 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)a_01,5,&SECP256K1_SIGNED62_ONE,0);
          if (iVar2 == 0) {
            a_01 = (secp256k1_ge *)auStack_168;
            psVar19 = (secp256k1_ge *)0x5;
            pcStack_1c0 = (code *)0x14e541;
            iVar2 = secp256k1_modinv64_mul_cmp_62
                              ((secp256k1_modinv64_signed62 *)a_01,5,&psVar1->modulus,1);
            if (iVar2 == 0) goto LAB_0014e549;
          }
        }
        goto LAB_0014e617;
      }
    }
LAB_0014e549:
    pcStack_1c0 = (code *)0x14e561;
    secp256k1_modinv64_normalize_62(&sStack_a8,auStack_168._32_8_,psVar1);
    (a_02->x).n[4] = sStack_a8.v[4];
    (a_02->x).n[2] = sStack_a8.v[2];
    (a_02->x).n[3] = sStack_a8.v[3];
    (a_02->x).n[0] = sStack_a8.v[0];
    (a_02->x).n[1] = sStack_a8.v[1];
    return;
  }
LAB_0014e612:
  pcStack_1c0 = (code *)0x14e617;
  secp256k1_modinv64_cold_16();
LAB_0014e617:
  pcStack_1c0 = secp256k1_eckey_pubkey_tweak_add;
  secp256k1_modinv64_cold_17();
  psStack_1d0 = psVar7;
  psStack_1c8 = a_02;
  pcStack_1c0 = (code *)uVar10;
  secp256k1_gej_set_ge(&sStack_b38,a_01);
  sStack_b50.aux = asStack_aa0;
  sStack_b50.pre_a = asStack_920;
  sStack_b50.ps = &sStack_5e0;
  secp256k1_ecmult_strauss_wnaf
            (&sStack_b50,&sStack_b38,1,&sStack_b38,&secp256k1_scalar_one,(secp256k1_scalar *)psVar19
            );
  secp256k1_gej_verify(&sStack_b38);
  if (sStack_b38.infinity == 0) {
    secp256k1_ge_set_gej(a_01,&sStack_b38);
  }
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_mul_int_unchecked(secp256k1_fe *r, int a) {
    SECP256K1_FE_VERIFY(r);

    VERIFY_CHECK(a >= 0 && a <= 32);
    VERIFY_CHECK(a*r->magnitude <= 32);
    secp256k1_fe_impl_mul_int_unchecked(r, a);
    r->magnitude *= a;
    r->normalized = 0;

    SECP256K1_FE_VERIFY(r);
}